

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef CompileLlvmDoWhile(LlvmCompilationContext *ctx,ExprDoWhile *node)

{
  TypeBase *type;
  LoopInfo local_28;
  
  local_28.breakBlock = (LLVMBasicBlockRef)&placeholderBasicBlock;
  local_28.continueBlock = (LLVMBasicBlockRef)&placeholderBasicBlock;
  SmallArray<LlvmCompilationContext::LoopInfo,_32U>::push_back(&ctx->loopInfo,&local_28);
  CompileLlvm(ctx,node->body);
  CompileLlvm(ctx,node->condition);
  type = GetStackType(ctx,node->condition->type);
  CompileLlvmType(ctx,type);
  SmallArray<LlvmCompilationContext::LoopInfo,_32U>::pop_back(&ctx->loopInfo);
  CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)0x0);
  return (LLVMValueRef)0x0;
}

Assistant:

LLVMValueRef CompileLlvmDoWhile(LlvmCompilationContext &ctx, ExprDoWhile *node)
{
	LLVMBasicBlockRef bodyBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "do_body");
	LLVMBasicBlockRef condBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "do_cond");
	LLVMBasicBlockRef exitBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "do_exit");

	LLVMBuildBr(ctx.builder, bodyBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, bodyBlock);

	ctx.loopInfo.push_back(LlvmCompilationContext::LoopInfo(exitBlock, condBlock));

	CompileLlvm(ctx, node->body);

	LLVMBuildBr(ctx.builder, condBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, condBlock);

	LLVMValueRef condition = CompileLlvm(ctx, node->condition);

	condition = LLVMBuildICmp(ctx.builder, LLVMIntNE, condition, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->condition->type)), 0, true), "");

	LLVMBuildCondBr(ctx.builder, condition, bodyBlock, exitBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, exitBlock);

	ctx.loopInfo.pop_back();

	return CheckType(ctx, node, NULL);
}